

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageColorContrast(Image *image,float contrast)

{
  ushort uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Color *pCVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uchar uVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar22 [16];
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    fVar14 = -100.0;
    if (-100.0 <= contrast) {
      fVar14 = contrast;
    }
    fVar15 = 100.0;
    if (fVar14 <= 100.0) {
      fVar15 = fVar14;
    }
    fVar14 = (fVar15 + 100.0) / 100.0;
    fVar14 = fVar14 * fVar14;
    pCVar5 = LoadImageColors(*image);
    auVar3 = _DAT_00154900;
    iVar6 = 0;
    iVar4 = image->height;
    if (image->height < 1) {
      iVar4 = 0;
    }
    fVar15 = (float)DAT_00154900;
    fVar16 = DAT_00154900._4_4_;
    fVar17 = DAT_00154900._8_4_;
    fVar18 = DAT_00154900._12_4_;
    for (; iVar6 != iVar4; iVar6 = iVar6 + 1) {
      uVar10 = image->width;
      uVar7 = 0;
      if (0 < (int)uVar10) {
        uVar7 = (ulong)uVar10;
      }
      lVar8 = (long)(int)(uVar10 * iVar6);
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        uVar1._0_1_ = pCVar5[lVar8 + uVar9].r;
        uVar1._1_1_ = pCVar5[lVar8 + uVar9].g;
        auVar20._0_4_ = (float)(uVar1 & 0xff);
        auVar20._4_4_ = (float)(byte)uVar1._1_1_;
        auVar20._8_8_ = 0;
        auVar20 = divps(auVar20,auVar3);
        auVar21._0_4_ = ((auVar20._0_4_ + -0.5) * fVar14 + 0.5) * fVar15;
        auVar21._4_4_ = ((auVar20._4_4_ + -0.5) * fVar14 + 0.5) * fVar16;
        auVar21._8_4_ = ((auVar20._8_4_ + 0.0) * fVar14 + 0.0) * fVar17;
        auVar21._12_4_ = ((auVar20._12_4_ + 0.0) * fVar14 + 0.0) * fVar18;
        auVar20 = maxps(ZEXT816(0),auVar21);
        iVar12 = -(uint)(fVar15 < auVar20._0_4_);
        iVar13 = -(uint)(fVar16 < auVar20._4_4_);
        auVar23._4_4_ = iVar13;
        auVar23._0_4_ = iVar12;
        auVar23._8_4_ = iVar13;
        auVar23._12_4_ = iVar13;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._4_4_ = iVar12;
        auVar22._0_4_ = iVar12;
        uVar10 = movmskpd((uint)uVar1,auVar22);
        fVar19 = (((float)pCVar5[lVar8 + uVar9].b / 255.0 + -0.5) * fVar14 + 0.5) * 255.0;
        fVar2 = 0.0;
        if (0.0 <= fVar19) {
          fVar2 = fVar19;
        }
        fVar19 = 255.0;
        if (fVar2 <= 255.0) {
          fVar19 = fVar2;
        }
        uVar11 = (uchar)(int)auVar20._0_4_;
        if ((uVar10 & 1) != 0) {
          uVar11 = 0xff;
        }
        pCVar5[lVar8 + uVar9].r = uVar11;
        uVar11 = (uchar)(int)auVar20._4_4_;
        if ((uVar10 & 2) != 0) {
          uVar11 = 0xff;
        }
        pCVar5[lVar8 + uVar9].g = uVar11;
        pCVar5[lVar8 + uVar9].b = (uchar)(int)fVar19;
      }
    }
    iVar4 = image->format;
    free(image->data);
    image->data = pCVar5;
    image->format = 7;
    ImageFormat(image,iVar4);
    return;
  }
  return;
}

Assistant:

void ImageColorContrast(Image *image, float contrast)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (contrast < -100) contrast = -100;
    if (contrast > 100) contrast = 100;

    contrast = (100.0f + contrast)/100.0f;
    contrast *= contrast;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            float pR = (float)pixels[y*image->width + x].r/255.0f;
            pR -= 0.5;
            pR *= contrast;
            pR += 0.5;
            pR *= 255;
            if (pR < 0) pR = 0;
            if (pR > 255) pR = 255;

            float pG = (float)pixels[y*image->width + x].g/255.0f;
            pG -= 0.5;
            pG *= contrast;
            pG += 0.5;
            pG *= 255;
            if (pG < 0) pG = 0;
            if (pG > 255) pG = 255;

            float pB = (float)pixels[y*image->width + x].b/255.0f;
            pB -= 0.5;
            pB *= contrast;
            pB += 0.5;
            pB *= 255;
            if (pB < 0) pB = 0;
            if (pB > 255) pB = 255;

            pixels[y*image->width + x].r = (unsigned char)pR;
            pixels[y*image->width + x].g = (unsigned char)pG;
            pixels[y*image->width + x].b = (unsigned char)pB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}